

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

bool testing::internal::
     TypeParameterizedTest<(anonymous_namespace)::BitFieldAssignment,_testing::internal::TemplateSel<BitFieldAssignment_Assignment_Test>,_testing::internal::Types<(anonymous_namespace)::param<unsigned_char,_0U,_1U>,_(anonymous_namespace)::param<unsigned_char,_1U,_1U>,_(anonymous_namespace)::param<unsigned_char,_7U,_1U>,_(anonymous_namespace)::param<unsigned_short,_8U,_1U>,_(anonymous_namespace)::param<unsigned_short,_15U,_1U>,_(anonymous_namespace)::param<unsigned_int,_16U,_1U>,_(anonymous_namespace)::param<unsigned_int,_31U,_1U>,_(anonymous_namespace)::param<unsigned_long,_32U,_1U>,_(anonymous_namespace)::param<unsigned_long,_63U,_1U>,_(anonymous_namespace)::param<unsigned_char,_0U,_2U>,_(anonymous_namespace)::param<unsigned_char,_1U,_2U>,_(anonymous_namespace)::param<unsigned_char,_6U,_2U>,_(anonymous_namespace)::param<unsigned_short,_7U,_2U>,_(anonymous_namespace)::param<unsigned_short,_8U,_2U>,_(anonymous_namespace)::param<unsigned_short,_14U,_2U>,_(anonymous_namespace)::param<unsigned_int,_15U,_2U>,_(anonymous_namespace)::param<unsigned_int,_16U,_2U>,_(anonymous_namespace)::param<unsigned_long,_31U,_2U>,_(anonymous_namespace)::param<unsigned_long,_32U,_2U>,_(anonymous_namespace)::param<unsigned_long,_62U,_2U>,_(anonymous_namespace)::param<unsigned_char,_0U,_7U>,_(anonymous_namespace)::param<unsigned_char,_0U,_8U>,_(anonymous_namespace)::param<unsigned_short,_0U,_9U>,_(anonymous_namespace)::param<unsigned_short,_0U,_15U>,_(anonymous_namespace)::param<unsigned_short,_0U,_16U>,_(anonymous_namespace)::param<unsigned_int,_0U,_17U>,_(anonymous_namespace)::param<unsigned_int,_0U,_31U>,_(anonymous_namespace)::param<unsigned_int,_0U,_32U>,_(anonymous_namespace)::param<unsigned_long,_0U,_63U>,_(anonymous_namespace)::param<unsigned_long,_0U,_64U>_>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  bool bVar1;
  const_reference __rhs;
  char *type_param;
  TypeId fixture_class_id;
  char *pcVar2;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  char *pcVar3;
  undefined1 auVar4 [16];
  CodeLocation local_178;
  string local_150 [32];
  string local_130;
  string local_110;
  allocator local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *type_names_local;
  internal *piStack_28;
  int index_local;
  char *test_names_local;
  char *case_name_local;
  CodeLocation *code_location_local;
  char *prefix_local;
  
  local_38 = type_names;
  type_names_local._4_4_ = index;
  piStack_28 = (internal *)test_names;
  test_names_local = case_name;
  case_name_local = (char *)code_location;
  code_location_local = (CodeLocation *)prefix;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,prefix,&local_d9);
  pcVar3 = "/";
  if ((code_location_local->file)._M_dataplus == (_Alloc_hider)0x0) {
    pcVar3 = anon_var_dwarf_4b06e + 0x50;
  }
  std::operator+(&local_b8,&local_d8,pcVar3);
  std::operator+(&local_98,&local_b8,test_names_local);
  std::operator+(&local_78,&local_98,"/");
  __rhs = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_38,(long)type_names_local._4_4_);
  std::operator+(&local_58,&local_78,__rhs);
  auVar4 = std::__cxx11::string::c_str();
  GetPrefixUntilComma_abi_cxx11_(&local_130,piStack_28,auVar4._8_8_);
  StripTrailingSpaces(&local_110,&local_130);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  GetTypeName<(anonymous_namespace)::param<unsigned_char,0u,1u>>();
  type_param = (char *)std::__cxx11::string::c_str();
  CodeLocation::CodeLocation(&local_178,(CodeLocation *)case_name_local);
  fixture_class_id =
       GetTypeId<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_char,0u,1u>>>
                 ();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  set_up_tc = SuiteApiResolver<BitFieldAssignment_Assignment_Test<(anonymous_namespace)::param<unsigned_char,_0U,_1U>_>_>
              ::GetSetUpCaseOrSuite(pcVar2,*(int *)(case_name_local + 0x20));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  tear_down_tc = SuiteApiResolver<BitFieldAssignment_Assignment_Test<(anonymous_namespace)::param<unsigned_char,_0U,_1U>_>_>
                 ::GetTearDownCaseOrSuite(pcVar2,*(int *)(case_name_local + 0x20));
  factory = (TestFactoryBase *)operator_new(8);
  TestFactoryImpl<BitFieldAssignment_Assignment_Test<(anonymous_namespace)::param<unsigned_char,_0U,_1U>_>_>
  ::TestFactoryImpl((TestFactoryImpl<BitFieldAssignment_Assignment_Test<(anonymous_namespace)::param<unsigned_char,_0U,_1U>_>_>
                     *)factory);
  MakeAndRegisterTestInfo
            (auVar4._0_8_,pcVar3,type_param,(char *)0x0,&local_178,fixture_class_id,set_up_tc,
             tear_down_tc,factory);
  CodeLocation::~CodeLocation(&local_178);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  bVar1 = TypeParameterizedTest<(anonymous_namespace)::BitFieldAssignment,_testing::internal::TemplateSel<BitFieldAssignment_Assignment_Test>,_testing::internal::Types<(anonymous_namespace)::param<unsigned_char,_1U,_1U>,_(anonymous_namespace)::param<unsigned_char,_7U,_1U>,_(anonymous_namespace)::param<unsigned_short,_8U,_1U>,_(anonymous_namespace)::param<unsigned_short,_15U,_1U>,_(anonymous_namespace)::param<unsigned_int,_16U,_1U>,_(anonymous_namespace)::param<unsigned_int,_31U,_1U>,_(anonymous_namespace)::param<unsigned_long,_32U,_1U>,_(anonymous_namespace)::param<unsigned_long,_63U,_1U>,_(anonymous_namespace)::param<unsigned_char,_0U,_2U>,_(anonymous_namespace)::param<unsigned_char,_1U,_2U>,_(anonymous_namespace)::param<unsigned_char,_6U,_2U>,_(anonymous_namespace)::param<unsigned_short,_7U,_2U>,_(anonymous_namespace)::param<unsigned_short,_8U,_2U>,_(anonymous_namespace)::param<unsigned_short,_14U,_2U>,_(anonymous_namespace)::param<unsigned_int,_15U,_2U>,_(anonymous_namespace)::param<unsigned_int,_16U,_2U>,_(anonymous_namespace)::param<unsigned_long,_31U,_2U>,_(anonymous_namespace)::param<unsigned_long,_32U,_2U>,_(anonymous_namespace)::param<unsigned_long,_62U,_2U>,_(anonymous_namespace)::param<unsigned_char,_0U,_7U>,_(anonymous_namespace)::param<unsigned_char,_0U,_8U>,_(anonymous_namespace)::param<unsigned_short,_0U,_9U>,_(anonymous_namespace)::param<unsigned_short,_0U,_15U>,_(anonymous_namespace)::param<unsigned_short,_0U,_16U>,_(anonymous_namespace)::param<unsigned_int,_0U,_17U>,_(anonymous_namespace)::param<unsigned_int,_0U,_31U>,_(anonymous_namespace)::param<unsigned_int,_0U,_32U>,_(anonymous_namespace)::param<unsigned_long,_0U,_63U>,_(anonymous_namespace)::param<unsigned_long,_0U,_64U>_>_>
          ::Register((char *)code_location_local,(CodeLocation *)case_name_local,test_names_local,
                     (char *)piStack_28,type_names_local._4_4_ + 1,local_38);
  return bVar1;
}

Assistant:

static bool Register(const char* prefix, const CodeLocation& code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)])
            .c_str(),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel,
                                 typename Types::Tail>::Register(prefix,
                                                                 code_location,
                                                                 case_name,
                                                                 test_names,
                                                                 index + 1,
                                                                 type_names);
  }